

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TransformFeedbackHandler<tcu::Vector<float,_3>_>::
TransformFeedbackHandler
          (TransformFeedbackHandler<tcu::Vector<float,_3>_> *this,RenderContext *renderCtx,
          int maxNumVertices)

{
  int iVar1;
  undefined4 extraout_var;
  ObjectTraits *pOVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  this->m_renderCtx = renderCtx;
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar2 = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
  glu::ObjectWrapper::ObjectWrapper
            (&(this->m_tf).super_ObjectWrapper,(Functions *)CONCAT44(extraout_var,iVar1),pOVar2);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar2 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&(this->m_tfBuffer).super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar1),
             pOVar2);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar2 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&(this->m_tfPrimQuery).super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar1)
             ,pOVar2);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x40))
            (0x8c8e,(this->m_tfBuffer).super_ObjectWrapper.m_object);
  (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x150))
            (0x8c8e,(long)(maxNumVertices * 0xc + 0x24),0,0x88e9);
  return;
}

Assistant:

TransformFeedbackHandler<AttribType>::TransformFeedbackHandler (const glu::RenderContext& renderCtx, int maxNumVertices)
	: m_renderCtx		(renderCtx)
	, m_tf				(renderCtx)
	, m_tfBuffer		(renderCtx)
	, m_tfPrimQuery		(renderCtx)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	// \note Room for 1 extra triangle, to detect if GL returns too many primitives.
	const int				bufferSize	= (maxNumVertices + 3) * (int)sizeof(AttribType);

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, *m_tfBuffer);
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_READ);
}